

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O2

int KillAll(PClassActor *cls)

{
  bool bVar1;
  AActor *this;
  PClassActor *pPVar2;
  int iVar3;
  TThinkerIterator<AActor> iterator;
  FThinkerIterator FStack_38;
  
  FThinkerIterator::FThinkerIterator(&FStack_38,&cls->super_PClass,0x80);
  iVar3 = 0;
  while( true ) {
    this = (AActor *)FThinkerIterator::Next(&FStack_38,false);
    if (this == (AActor *)0x0) break;
    pPVar2 = (PClassActor *)DObject::GetClass((DObject *)this);
    if (((pPVar2 == cls) && (((this->flags2).Value & 0x10000000) == 0)) &&
       (((this->flags3).Value & 0x2000) != 0)) {
      bVar1 = AActor::Massacre(this);
      iVar3 = iVar3 + (uint)bVar1;
    }
  }
  return iVar3;
}

Assistant:

static int KillAll(PClassActor *cls)
{
	AActor *actor;
	int killcount = 0;
	TThinkerIterator<AActor> iterator(cls);
	while ( (actor = iterator.Next ()) )
	{
		if (actor->IsA(cls))
		{
			if (!(actor->flags2 & MF2_DORMANT) && (actor->flags3 & MF3_ISMONSTER))
					killcount += actor->Massacre ();
		}
	}
	return killcount;

}